

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fNegativeShaderApiTests.cpp
# Opt level: O0

void deqp::gles31::Functional::NegativeTestShared::uniformf_invalid_program
               (NegativeTestContext *ctx)

{
  allocator<char> local_31;
  string local_30;
  NegativeTestContext *local_10;
  NegativeTestContext *ctx_local;
  
  local_10 = ctx;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "GL_INVALID_OPERATION is generated if there is no current program object.",&local_31);
  NegativeTestContext::beginSection(ctx,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  glu::CallLogWrapper::glUseProgram(&local_10->super_CallLogWrapper,0);
  glu::CallLogWrapper::glUniform1f(&local_10->super_CallLogWrapper,-1,0.0);
  NegativeTestContext::expectError(local_10,0x502);
  glu::CallLogWrapper::glUniform2f(&local_10->super_CallLogWrapper,-1,0.0,0.0);
  NegativeTestContext::expectError(local_10,0x502);
  glu::CallLogWrapper::glUniform3f(&local_10->super_CallLogWrapper,-1,0.0,0.0,0.0);
  NegativeTestContext::expectError(local_10,0x502);
  glu::CallLogWrapper::glUniform4f(&local_10->super_CallLogWrapper,-1,0.0,0.0,0.0,0.0);
  NegativeTestContext::expectError(local_10,0x502);
  NegativeTestContext::endSection(local_10);
  return;
}

Assistant:

void uniformf_invalid_program (NegativeTestContext& ctx)
{
	ctx.beginSection("GL_INVALID_OPERATION is generated if there is no current program object.");
	ctx.glUseProgram(0);
	ctx.glUniform1f(-1, 0.0f);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform2f(-1, 0.0f, 0.0f);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform3f(-1, 0.0f, 0.0f, 0.0f);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.glUniform4f(-1, 0.0f, 0.0f, 0.0f, 0.0f);
	ctx.expectError(GL_INVALID_OPERATION);
	ctx.endSection();
}